

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O0

ByteData256 * __thiscall
cfd::core::HashUtil::Output256(ByteData256 *__return_storage_ptr__,HashUtil *this)

{
  undefined8 uVar1;
  ByteData256 *pBVar2;
  CfdError error_code;
  allocator local_39;
  string local_38 [32];
  HashUtil *local_18;
  HashUtil *this_local;
  
  local_18 = this;
  this_local = (HashUtil *)__return_storage_ptr__;
  switch(this->hash_type_) {
  case '\x01':
  case '\x02':
  case '\x05':
  default:
    pBVar2 = __return_storage_ptr__;
    uVar1 = __cxa_allocate_exception(0x30);
    error_code = (CfdError)((ulong)pBVar2 >> 0x20);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_38,"unknown hash type.",&local_39);
    CfdException::CfdException((CfdException *)this,error_code,(string *)__return_storage_ptr__);
    __cxa_throw(uVar1,&CfdException::typeinfo,CfdException::~CfdException);
  case '\x03':
    Sha256(__return_storage_ptr__,&this->buffer_);
    break;
  case '\x04':
    Sha256D(__return_storage_ptr__,&this->buffer_);
  }
  return __return_storage_ptr__;
}

Assistant:

ByteData256 HashUtil::Output256() {
  switch (hash_type_) {
    case kSha256:
      return Sha256(buffer_);
    case kSha256D:
      return Sha256D(buffer_);
    case kRipemd160:
      // fall-through
    case kHash160:
      // fall-through
    case kSha512:
      // fall-through
    default:
      throw CfdException(kCfdInternalError, "unknown hash type.");
  }
}